

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManLutSizeMax(Gia_Man_t *p)

{
  int iVar1;
  int nSizeMax;
  int iVar2;
  int i;
  int Id;
  
  iVar2 = -1;
  Id = 1;
  while( true ) {
    if (p->nObjs <= Id) break;
    iVar1 = Gia_ObjIsLut(p,Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p,Id);
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
    }
    Id = Id + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManLutSizeMax( Gia_Man_t * p )
{
    int i, nSizeMax = -1;
    Gia_ManForEachLut( p, i )
        nSizeMax = Abc_MaxInt( nSizeMax, Gia_ObjLutSize(p, i) );
    return nSizeMax;
}